

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boyer_moore.hpp
# Opt level: O0

__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 __thiscall
boost::xpressive::detail::
boyer_moore<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
::find_nocase_(boyer_moore<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
               *this,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     begin,
              __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              end,regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *tr)

{
  char_type cVar1;
  byte bVar2;
  difference_type dVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__i;
  cpp_regex_traits<char> *in_RCX;
  char *in_RDX;
  char *in_RSI;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RDI;
  char_type *pat_tmp;
  diff_type curpos;
  diff_type offset;
  diff_type endpos;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  str_tmp;
  char_type in_stack_ffffffffffffff8f;
  cpp_regex_traits<char> *in_stack_ffffffffffffff90;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8;
  
  local_10._M_current = in_RSI;
  dVar3 = std::distance<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    (in_RDI,in_stack_ffffffffffffff98);
  __i = (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(ulong)(byte)in_RDI._M_current[0x38];
  do {
    if (dVar3 <= (long)__i) {
      return (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )in_RDX;
    }
    std::advance<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,long>
              (__i,(long)in_stack_ffffffffffffffa8);
    in_stack_ffffffffffffffa8 = *(char **)(in_RDI._M_current + 8);
    local_8._M_current = local_10._M_current;
    while( true ) {
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator*(&local_8);
      cVar1 = cpp_regex_traits<char>::translate_nocase
                        (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8f);
      if (cVar1 != *in_stack_ffffffffffffffa8) break;
      if (in_stack_ffffffffffffffa8 == *in_RDI._M_current) {
        return (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )local_8._M_current;
      }
      in_stack_ffffffffffffffa8 = in_stack_ffffffffffffffa8 + -1;
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator--(&local_8);
    }
    in_stack_ffffffffffffff90 = in_RCX;
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator*(&local_10);
    cVar1 = cpp_regex_traits<char>::translate_nocase
                      (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8f);
    bVar2 = cpp_regex_traits<char>::hash(cVar1);
    __i = (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)((long)&__i->_M_current + (ulong)(byte)in_RDI._M_current[(ulong)bVar2 + 0x39]);
  } while( true );
}

Assistant:

BidiIter find_nocase_(BidiIter begin, BidiIter end, Traits const &tr) const
    {
        typedef typename boost::iterator_difference<BidiIter>::type diff_type;
        diff_type const endpos = std::distance(begin, end);
        diff_type offset = static_cast<diff_type>(this->length_);

        for(diff_type curpos = offset; curpos < endpos; curpos += offset)
        {
            std::advance(begin, offset);

            char_type const *pat_tmp = this->last_;
            BidiIter str_tmp = begin;

            for(; tr.translate_nocase(*str_tmp) == *pat_tmp; --pat_tmp, --str_tmp)
            {
                if(pat_tmp == this->begin_)
                {
                    return str_tmp;
                }
            }

            offset = this->offsets_[tr.hash(tr.translate_nocase(*begin))];
        }

        return end;
    }